

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O2

void __thiscall Enterprise::Nick::output_pixel<8,false>(Nick *this,uint16_t *target,int columns)

{
  uint8_t source;
  uint8_t source_00;
  uint8_t *puVar1;
  uint16_t uVar2;
  int iVar3;
  ulong uVar5;
  ulong uVar4;
  
  puVar1 = this->ram_;
  uVar5 = 0;
  uVar4 = (ulong)(uint)columns;
  if (columns < 1) {
    uVar4 = uVar5;
  }
  while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
    source = puVar1[(uint)this->line_data_pointer_[0] + (int)uVar5 & 0xffff];
    source_00 = puVar1[(uint)this->line_data_pointer_[0] + (int)uVar5 + 1 & 0xffff];
    this->last_read_ = source_00;
    uVar2 = anon_unknown.dwarf_b5cc96::mapped_colour(source);
    target[uVar5] = uVar2;
    uVar2 = anon_unknown.dwarf_b5cc96::mapped_colour(source_00);
    target[uVar5 + 1] = uVar2;
    uVar5 = uVar5 + 2;
  }
  return;
}

Assistant:

void Nick::output_pixel(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	int index = 0;
	for(int c = 0; c < columns; c++) {
		uint8_t pixels[2] = {
			ram_[(line_data_pointer_[0] + index) & 0xffff],
			ram_[(line_data_pointer_[0] + index + 1) & 0xffff]
		};
		index += is_lpixel ? 1 : 2;
		last_read_ = pixels[1];

		switch(bpp) {
			default:
			case 1: {
				const uint16_t *palette = alt_ind_palettes[((pixels[0] >> 6) & 0x02) | (pixels[0]&1)];
				pixels[0] &= two_colour_mask_;
				output1bpp(pixels[0]);

				if constexpr (!is_lpixel) {
					palette = alt_ind_palettes[((pixels[1] >> 6) & 0x02) | (pixels[1]&1)];
					pixels[1] &= two_colour_mask_;
					output1bpp(pixels[1]);
				}
			} break;

			case 2:
				output2bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output2bpp(pixels[1]);
				}
			break;

			case 4:
				output4bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output4bpp(pixels[1]);
				}
			break;

			case 8:
				output8bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output8bpp(pixels[1]);
				}
			break;
		}
	}
}